

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float __thiscall
tcu::ConstPixelBufferAccess::sample2DCompare
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float ref,float s,float t
          ,IVec3 *offset)

{
  int iVar1;
  int size;
  WrapMode mode;
  WrapMode mode_00;
  CompareMode compare;
  bool isFixedPoint;
  int j;
  int iVar2;
  int k;
  int iVar3;
  int i;
  bool bVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec4 p00Clr;
  Vec4 p11Clr;
  Vec4 p01Clr;
  Vec4 p10Clr;
  float local_a4;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  Vec4 local_50;
  Vec4 local_40;
  
  isFixedPoint = isFixedPointDepthTextureFormat(&this->m_format);
  local_a4 = s;
  if (sampler->normalizedCoords == true) {
    local_a4 = unnormalize(sampler->wrapS,s,(this->m_size).m_data[0]);
    t = unnormalize(sampler->wrapT,t,(this->m_size).m_data[1]);
  }
  if (filter == LINEAR) {
    iVar1 = (this->m_size).m_data[0];
    size = (this->m_size).m_data[1];
    fVar7 = floorf(local_a4 + -0.5);
    iVar2 = offset->m_data[0];
    iVar3 = offset->m_data[1];
    fVar6 = floorf(t + -0.5);
    mode = sampler->wrapS;
    j = wrap(mode,iVar2 + (int)fVar7,iVar1);
    iVar2 = wrap(mode,iVar2 + (int)fVar7 + 1,iVar1);
    mode_00 = sampler->wrapT;
    k = wrap(mode_00,iVar3 + (int)fVar6,size);
    iVar3 = wrap(mode_00,(int)fVar6 + iVar3 + 1,size);
    bVar4 = mode != CLAMP_TO_BORDER;
    bVar5 = mode_00 != CLAMP_TO_BORDER;
    i = (int)this;
    if ((bVar4 || j < iVar1 && -1 < j) && (bVar5 || k < size && -1 < k)) {
      lookup((ConstPixelBufferAccess *)local_70,i,j,k);
    }
    else {
      lookupBorder((tcu *)local_70,&this->m_format,sampler);
    }
    if ((bVar5 || k < size && -1 < k) && (bVar4 || iVar2 < iVar1 && -1 < iVar2)) {
      lookup((ConstPixelBufferAccess *)&local_40,i,iVar2,k);
    }
    else {
      lookupBorder((tcu *)&local_40,&this->m_format,sampler);
    }
    if ((bVar4 || j < iVar1 && -1 < j) && (bVar5 || iVar3 < size && -1 < iVar3)) {
      lookup((ConstPixelBufferAccess *)&local_50,i,j,iVar3);
    }
    else {
      lookupBorder((tcu *)&local_50,&this->m_format,sampler);
    }
    if ((bVar4 || iVar2 < iVar1 && -1 < iVar2) && (bVar5 || iVar3 < size && -1 < iVar3)) {
      lookup((ConstPixelBufferAccess *)local_60,i,iVar2,iVar3);
    }
    else {
      lookupBorder((tcu *)local_60,&this->m_format,sampler);
    }
    fVar6 = (t + -0.5) - fVar6;
    fVar7 = (local_a4 + -0.5) - fVar7;
    compare = sampler->compare;
    iVar1 = sampler->compareChannel;
    fVar8 = execCompare((Vec4 *)local_70,compare,iVar1,ref,isFixedPoint);
    fVar9 = execCompare(&local_40,compare,iVar1,ref,isFixedPoint);
    fVar10 = execCompare(&local_50,compare,iVar1,ref,isFixedPoint);
    fVar11 = execCompare((Vec4 *)local_60,compare,iVar1,ref,isFixedPoint);
    fVar6 = fVar11 * fVar7 * fVar6 +
            (1.0 - fVar7) * fVar10 * fVar6 +
            (1.0 - fVar6) * fVar8 * (1.0 - fVar7) + fVar9 * fVar7 * (1.0 - fVar6);
  }
  else {
    fVar6 = 0.0;
    if (filter == NEAREST) {
      sampleNearest2D((tcu *)local_70,this,sampler,local_a4,t,offset);
      fVar6 = execCompare((Vec4 *)local_70,sampler->compare,sampler->compareChannel,ref,isFixedPoint
                         );
    }
  }
  return fVar6;
}

Assistant:

float ConstPixelBufferAccess::sample2DCompare (const Sampler& sampler, Sampler::FilterMode filter, float ref, float s, float t, const IVec3& offset) const
{
	// check selected layer exists
	// \note offset.xy is XY offset, offset.z is the selected layer
	DE_ASSERT(de::inBounds(offset.z(), 0, m_size.z()));

	// Format information for comparison function
	const bool isFixedPointDepth = isFixedPointDepthTextureFormat(m_format);

	// Non-normalized coordinates.
	float u = s;
	float v = t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return execCompare(sampleNearest2D(*this, sampler, u, v, offset), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		case Sampler::LINEAR:	return sampleLinear2DCompare(*this, sampler, ref, u, v, offset, isFixedPointDepth);
		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}